

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O2

void __thiscall
Clasp::mt::LocalDistribution::LocalDistribution
          (LocalDistribution *this,Policy *p,uint32 maxT,uint32 topo)

{
  __pointer_type pNVar1;
  ThreadData **ppTVar2;
  ThreadData *pTVar3;
  uint64 uVar4;
  ulong uVar5;
  
  Distributor::Distributor(&this->super_Distributor,p);
  (this->super_Distributor)._vptr_Distributor = (_func_int **)&PTR__LocalDistribution_001ea3b0;
  this->thread_ = (ThreadData **)0x0;
  LOCK();
  (this->blocks_).top._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  this->numThread_ = maxT;
  ppTVar2 = (ThreadData **)operator_new__((ulong)maxT * 8);
  this->thread_ = ppTVar2;
  for (uVar5 = 0; maxT != uVar5; uVar5 = uVar5 + 1) {
    pTVar3 = (ThreadData *)alignedAllocChecked(0x80,(size_t)p);
    LOCK();
    (pTVar3->sentinel).super_RawNode.next._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    (pTVar3->sentinel).data = (void *)0x0;
    LOCK();
    pNVar1 = (pTVar3->received).head_._M_b._M_p;
    (pTVar3->received).head_._M_b._M_p = &pTVar3->sentinel;
    UNLOCK();
    (pTVar3->received).tail_ = &pTVar3->sentinel;
    p = (Policy *)(ulong)topo;
    uVar4 = ParallelSolveOptions::initPeerMask
                      ((ParallelSolveOptions *)(uVar5 & 0xffffffff),topo,maxT,(uint32)pNVar1);
    pTVar3->peers = uVar4;
    pTVar3->free = (QNode *)0x0;
    this->thread_[uVar5] = pTVar3;
  }
  return;
}

Assistant:

LocalDistribution::LocalDistribution(const Policy& p, uint32 maxT, uint32 topo) : Distributor(p), thread_(0), numThread_(0) {
	typedef ParallelSolveOptions::Integration::Topology Topology;
	assert(maxT <= ParallelSolveOptions::supportedSolvers());
	Topology t = static_cast<Topology>(topo);
	thread_    = new ThreadData*[numThread_ = maxT];
	size_t sz  = ((sizeof(ThreadData) + 63) / 64) * 64;
	for (uint32 i = 0; i != maxT; ++i) {
		ThreadData* ti = new (alignedAllocChecked(sz)) ThreadData;
		ti->received.init(&ti->sentinel);
		ti->peers = ParallelSolveOptions::initPeerMask(i, t, maxT);
		ti->free  = 0;
		thread_[i]= ti;
	}
}